

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

libcaption_stauts_t cea708_parse_h264(uint8_t *data,size_t size,cea708_t *cea708)

{
  byte *data_00;
  ulong size_00;
  cc_data_t cVar1;
  user_data_t *in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  libcaption_stauts_t local_4;
  
  if (in_RSI < 3) {
LAB_0010d576:
    local_4 = LIBCAPTION_ERROR;
  }
  else {
    *(uint *)in_RDX = (uint)*in_RDI;
    cVar1._1_1_ = in_RDI[1];
    cVar1._0_1_ = in_RDI[2];
    cVar1._2_2_ = 0;
    in_RDX->cc_data[0] = cVar1;
    in_RDX->cc_data[1] = (cc_data_t)0x0;
    *(undefined1 *)(in_RDX->cc_data + 2) = 0;
    data_00 = in_RDI + 3;
    size_00 = in_RSI - 3;
    if (in_RDX->cc_data[0] == (cc_data_t)0x31) {
      if (size_00 < 4) goto LAB_0010d576;
      in_RDX->cc_data[1] =
           (cc_data_t)
           ((uint)*data_00 << 0x18 | (uint)in_RDI[4] << 0x10 | (uint)in_RDI[5] << 8 |
           (uint)in_RDI[6]);
      data_00 = in_RDI + 7;
      size_00 = in_RSI - 7;
    }
    if ((in_RDX->cc_data[0] == (cc_data_t)0x0) && (*(int *)in_RDX == 0)) {
      if (size_00 == 0) goto LAB_0010d576;
      data_00 = data_00 + 1;
      size_00 = size_00 - 1;
    }
    else if ((in_RDX->cc_data[0] == (cc_data_t)0x31) || (in_RDX->cc_data[0] == (cc_data_t)0x2f)) {
      if (size_00 == 0) goto LAB_0010d576;
      *(byte *)(in_RDX->cc_data + 2) = *data_00;
      data_00 = data_00 + 1;
      size_00 = size_00 - 1;
    }
    if (in_RDX->cc_data[0] == (cc_data_t)0x2f) {
      if (size_00 == 0) goto LAB_0010d576;
      in_RDX->cc_data[2].field_0x1 = *data_00;
      data_00 = data_00 + 1;
      size_00 = size_00 - 1;
    }
    if ((*(char *)(in_RDX->cc_data + 2) == '\x03') && (1 < size_00)) {
      cea708_parse_user_data_type_strcture(data_00,size_00,in_RDX);
    }
    local_4 = LIBCAPTION_OK;
  }
  return local_4;
}

Assistant:

libcaption_stauts_t cea708_parse_h264(const uint8_t* data, size_t size, cea708_t* cea708)
{
    if (3 > size) {
        goto error;
    }

    // I think the first few bytes need to be handled in mpeg
    cea708->country = (itu_t_t35_country_code_t)(data[0]);
    cea708->provider = (itu_t_t35_provider_code_t)((data[1] << 8) | data[2]);
    cea708->user_identifier = 0;
    cea708->user_data_type_code = 0;
    data += 3, size -= 3;

    if (t35_provider_atsc == cea708->provider) {
        if (4 > size) {
            goto error;
        }

        cea708->user_identifier = ((data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3]);
        data += 4, size -= 4;
    }

    // where country and provider are zero
    // Im not sure what this extra byte is. It sonly seesm to come up in onCaptionInfo
    // h264 spec seems to describe this
    if (0 == cea708->provider && 0 == cea708->country) {
        if (1 > size) {
            goto error;
        }

        data += 1, size -= 1;
    } else if (t35_provider_atsc == cea708->provider || t35_provider_direct_tv == cea708->provider) {
        if (1 > size) {
            goto error;
        }

        cea708->user_data_type_code = data[0];
        data += 1, size -= 1;
    }

    if (t35_provider_direct_tv == cea708->provider) {
        if (1 > size) {
            goto error;
        }

        cea708->directv_user_data_length = data[0];
        data += 1, size -= 1;
    }

    if (3 == cea708->user_data_type_code && 2 <= size) {
        cea708_parse_user_data_type_strcture(data, size, &cea708->user_data);
    } else if (4 == cea708->user_data_type_code) {
        // additional_CEA_608_data
    } else if (5 == cea708->user_data_type_code) {
        // luma_PAM_data
    } else {
        // ATSC_reserved_user_data
    }

    return LIBCAPTION_OK;
error:
    return LIBCAPTION_ERROR;
}